

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.cpp
# Opt level: O0

int __thiscall ncnn::Quantize::forward(Quantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar1;
  float scale_2;
  char *s8ptr_2;
  float *ptr_2;
  int q;
  float scale_1;
  char *s8ptr_1;
  float *ptr_1;
  int i;
  float scale;
  char *s8ptr;
  float *ptr;
  int channels;
  int h;
  int w;
  int dims;
  Mat *m;
  Mat *m_1;
  int in_stack_fffffffffffffc10;
  float in_stack_fffffffffffffc14;
  float scale_00;
  Allocator *in_stack_fffffffffffffc18;
  Allocator *in_stack_fffffffffffffc20;
  size_t in_stack_fffffffffffffc28;
  Mat *in_stack_fffffffffffffc30;
  undefined8 in_stack_fffffffffffffc38;
  Mat *in_stack_fffffffffffffc40;
  undefined4 local_38c;
  char local_358 [32];
  long local_338;
  undefined4 local_330;
  undefined4 local_32c;
  undefined4 local_328;
  undefined4 local_324;
  undefined4 local_320;
  undefined8 local_318;
  float *local_310;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined4 local_2e0;
  long local_2d8;
  undefined4 local_2d0;
  undefined4 local_2cc;
  undefined4 local_2c8;
  undefined4 local_2c4;
  undefined4 local_2c0;
  undefined8 local_2b8;
  long local_2b0;
  int local_2a8;
  undefined4 local_2a4;
  long local_2a0;
  long local_298;
  int local_290;
  undefined4 local_28c;
  long local_288;
  long local_280;
  int local_278;
  int local_274;
  undefined4 local_270;
  int local_26c;
  long *local_260;
  long *local_258;
  undefined8 *local_240;
  char *local_230;
  long *local_220;
  long *local_218;
  long *local_210;
  undefined8 *local_208;
  long *local_200;
  char *local_1f8;
  long *local_1f0;
  long local_1e8;
  long *local_1e0;
  undefined8 local_1d8;
  undefined8 *local_1d0;
  long local_1c8;
  long *local_1c0;
  undefined8 local_1b8;
  undefined8 *local_1b0;
  undefined8 local_1a8;
  undefined8 *local_1a0;
  int local_194;
  long *local_190;
  int local_184;
  long *local_180;
  undefined1 local_175;
  int local_174;
  undefined8 *local_168;
  undefined1 local_155;
  int local_154;
  char *local_148;
  char *local_100;
  undefined8 *local_e0;
  long *local_a8;
  long *local_a0;
  long *local_98;
  long local_90;
  undefined4 local_84;
  long local_80;
  float *local_78;
  undefined4 local_6c;
  int local_68;
  int local_64;
  char *local_60;
  long local_58;
  undefined4 local_4c;
  long local_48;
  long local_40;
  undefined4 local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_26c = (int)in_RSI[5];
  local_270 = *(undefined4 *)((long)in_RSI + 0x2c);
  local_274 = (int)in_RSI[6];
  local_278 = (int)in_RSI[7];
  local_260 = in_RDX;
  local_258 = in_RSI;
  if (local_26c == 1) {
    Mat::create(in_stack_fffffffffffffc30,(int)(in_stack_fffffffffffffc28 >> 0x20),
                (size_t)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
    local_210 = local_260;
    bVar1 = true;
    if (*local_260 != 0) {
      local_a8 = local_260;
      bVar1 = local_260[8] * (long)(int)local_260[7] == 0;
    }
    if (bVar1) {
      return -100;
    }
    local_200 = local_258;
    local_280 = *local_258;
    local_1f0 = local_260;
    local_288 = *local_260;
    local_1a0 = (undefined8 *)(in_RDI + 0xd8);
    local_1a8 = 0;
    local_28c = *(undefined4 *)*local_1a0;
    quantize((float *)in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18,
             in_stack_fffffffffffffc14,in_stack_fffffffffffffc10);
  }
  if (local_26c == 2) {
    Mat::create(in_stack_fffffffffffffc30,(int)(in_stack_fffffffffffffc28 >> 0x20),
                (int)in_stack_fffffffffffffc28,(size_t)in_stack_fffffffffffffc20,
                in_stack_fffffffffffffc18);
    local_218 = local_260;
    bVar1 = true;
    if (*local_260 != 0) {
      local_a0 = local_260;
      bVar1 = local_260[8] * (long)(int)local_260[7] == 0;
    }
    if (bVar1) {
      return -100;
    }
    for (local_290 = 0; local_290 < local_274; local_290 = local_290 + 1) {
      local_190 = local_258;
      local_194 = local_290;
      local_298 = *local_258 +
                  (long)*(int *)((long)local_258 + 0x2c) * (long)local_290 * local_258[2];
      local_180 = local_260;
      local_184 = local_290;
      local_2a0 = *local_260 +
                  (long)*(int *)((long)local_260 + 0x2c) * (long)local_290 * local_260[2];
      if (*(int *)(in_RDI + 0xd0) == 1) {
        local_1b0 = (undefined8 *)(in_RDI + 0xd8);
        local_1b8 = 0;
        local_38c = *(undefined4 *)*local_1b0;
      }
      else {
        local_1c0 = (long *)(in_RDI + 0xd8);
        local_1c8 = (long)local_290;
        local_38c = *(undefined4 *)(*local_1c0 + local_1c8 * 4);
      }
      local_2a4 = local_38c;
      quantize((float *)in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18,
               in_stack_fffffffffffffc14,in_stack_fffffffffffffc10);
    }
  }
  if (local_26c == 3) {
    Mat::create(in_stack_fffffffffffffc40,(int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
                (int)in_stack_fffffffffffffc38,(int)((ulong)in_stack_fffffffffffffc30 >> 0x20),
                in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
    local_220 = local_260;
    bVar1 = true;
    if (*local_260 != 0) {
      local_98 = local_260;
      bVar1 = local_260[8] * (long)(int)local_260[7] == 0;
    }
    if (bVar1) {
      return -100;
    }
    for (local_2a8 = 0; local_2a8 < local_278; local_2a8 = local_2a8 + 1) {
      local_168 = &local_2f8;
      local_2c = *(int *)((long)local_258 + 0x2c);
      local_30 = (int)local_258[6];
      local_34 = *(undefined4 *)((long)local_258 + 0x34);
      local_2b0 = *local_258 + local_258[8] * (long)local_2a8 * local_258[2];
      local_48 = local_258[2];
      local_4c = (undefined4)local_258[3];
      local_58 = local_258[4];
      local_28 = &local_2f8;
      local_18 = (long)local_2c * (long)local_30 * local_48;
      local_208 = &local_2f8;
      local_240 = &local_2f8;
      local_1c = 0x10;
      local_174 = local_2a8;
      local_175 = 1;
      local_2f8 = 0;
      local_2e8 = 0;
      local_2e0 = 0;
      local_2d0 = 0;
      local_2cc = 0;
      local_2c8 = 0;
      local_2c4 = 0;
      local_2c0 = 0;
      local_2b8 = 0;
      local_2f0 = 0;
      local_148 = local_358;
      local_64 = *(int *)((long)local_260 + 0x2c);
      local_68 = (int)local_260[6];
      local_6c = *(undefined4 *)((long)local_260 + 0x34);
      local_310 = (float *)(*local_260 + local_260[8] * (long)local_2a8 * local_260[2]);
      local_80 = local_260[2];
      local_84 = (undefined4)local_260[3];
      local_90 = local_260[4];
      local_60 = local_358;
      local_8 = (long)local_64 * (long)local_68 * local_80;
      local_1f8 = local_358;
      local_230 = local_358;
      local_c = 0x10;
      local_154 = local_2a8;
      local_155 = 1;
      local_358[0] = '\0';
      local_358[1] = '\0';
      local_358[2] = '\0';
      local_358[3] = '\0';
      local_358[4] = '\0';
      local_358[5] = '\0';
      local_358[6] = '\0';
      local_358[7] = '\0';
      local_358[0x10] = '\0';
      local_358[0x11] = '\0';
      local_358[0x12] = '\0';
      local_358[0x13] = '\0';
      local_358[0x14] = '\0';
      local_358[0x15] = '\0';
      local_358[0x16] = '\0';
      local_358[0x17] = '\0';
      local_358[0x18] = '\0';
      local_358[0x19] = '\0';
      local_358[0x1a] = '\0';
      local_358[0x1b] = '\0';
      local_330 = 0;
      local_32c = 0;
      local_328 = 0;
      local_324 = 0;
      local_320 = 0;
      local_318 = 0;
      local_358[8] = '\0';
      local_358[9] = '\0';
      local_358[10] = '\0';
      local_358[0xb] = '\0';
      local_358[0xc] = '\0';
      local_358[0xd] = '\0';
      local_358[0xe] = '\0';
      local_358[0xf] = '\0';
      if (*(int *)(in_RDI + 0xd0) == 1) {
        local_1d0 = (undefined8 *)(in_RDI + 0xd8);
        local_1d8 = 0;
        scale_00 = *(float *)*local_1d0;
      }
      else {
        local_1e0 = (long *)(in_RDI + 0xd8);
        local_1e8 = (long)local_2a8;
        scale_00 = *(float *)(*local_1e0 + local_1e8 * 4);
      }
      local_100 = local_230;
      local_e0 = local_240;
      local_78 = local_310;
      local_40 = local_2b0;
      local_338 = local_90;
      local_2d8 = local_58;
      quantize(local_310,local_230,scale_00,in_stack_fffffffffffffc10);
    }
  }
  return 0;
}

Assistant:

int Quantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int dims = bottom_blob.dims;
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int channels = bottom_blob.c;

    if (dims == 1)
    {
        top_blob.create(w, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        // assert scale_data_size == 1

        const float* ptr = bottom_blob;
        signed char* s8ptr = top_blob;

        const float scale = scale_data[0];

        quantize(ptr, s8ptr, scale, w);
    }

    if (dims == 2)
    {
        top_blob.create(w, h, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            const float* ptr = bottom_blob.row(i);
            signed char* s8ptr = top_blob.row<signed char>(i);

            const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[i];

            quantize(ptr, s8ptr, scale, w);
        }
    }

    if (dims == 3)
    {
        top_blob.create(w, h, channels, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            signed char* s8ptr = top_blob.channel(q);

            const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[q];

            quantize(ptr, s8ptr, scale, w * h);
        }
    }

    return 0;
}